

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

void Bmc_MnaFree(Bmc_Mna_t *p)

{
  Vec_Int_t *pVVar1;
  
  Cnf_DataFree(p->pCnf);
  pVVar1 = p->vPiMap;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vPiMap->pArray = (int *)0x0;
      pVVar1 = p->vPiMap;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_00573fec;
    }
    free(pVVar1);
    p->vPiMap = (Vec_Int_t *)0x0;
  }
LAB_00573fec:
  pVVar1 = p->vId2Var;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vId2Var->pArray = (int *)0x0;
      pVVar1 = p->vId2Var;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_00574028;
    }
    free(pVVar1);
    p->vId2Var = (Vec_Int_t *)0x0;
  }
LAB_00574028:
  pVVar1 = p->vInputs;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vInputs->pArray = (int *)0x0;
      pVVar1 = p->vInputs;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_00574064;
    }
    free(pVVar1);
    p->vInputs = (Vec_Int_t *)0x0;
  }
LAB_00574064:
  pVVar1 = p->vOutputs;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vOutputs->pArray = (int *)0x0;
      pVVar1 = p->vOutputs;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_005740a0;
    }
    free(pVVar1);
    p->vOutputs = (Vec_Int_t *)0x0;
  }
LAB_005740a0:
  pVVar1 = p->vNodes;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vNodes->pArray = (int *)0x0;
      pVVar1 = p->vNodes;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_005740dc;
    }
    free(pVVar1);
    p->vNodes = (Vec_Int_t *)0x0;
  }
LAB_005740dc:
  sat_solver_delete(p->pSat);
  free(p);
  return;
}

Assistant:

void Bmc_MnaFree( Bmc_Mna_t * p )
{
    Cnf_DataFree( p->pCnf );
    Vec_IntFreeP( &p->vPiMap );
    Vec_IntFreeP( &p->vId2Var );
    Vec_IntFreeP( &p->vInputs );
    Vec_IntFreeP( &p->vOutputs );
    Vec_IntFreeP( &p->vNodes );
    sat_solver_delete( p->pSat );
    ABC_FREE( p );
}